

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# maph.h
# Opt level: O0

int maph(int argc,char **argv)

{
  Settings *this;
  pointer *this_00;
  undefined4 nx;
  undefined4 ny;
  int iVar1;
  ostream *this_01;
  size_type sVar2;
  void *this_02;
  ulong uVar3;
  reference pvVar4;
  bool bVar5;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_518;
  undefined1 local_4f8 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels_1;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4c0;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_4a0;
  undefined1 local_480 [8];
  vector<unsigned_char,_std::allocator<unsigned_char>_> pixels;
  string local_448;
  int local_424;
  undefined1 local_420 [4];
  int i;
  vector<unsigned_int,_std::allocator<unsigned_int>_> idx;
  vector<unsigned_int,_std::allocator<unsigned_int>_> img;
  vector<unsigned_int,_std::allocator<unsigned_int>_> kernel;
  json inj;
  undefined1 local_3b8 [8];
  string fjson;
  Data d;
  Transformation t;
  Settings s;
  int io;
  char **argv_local;
  int argc_local;
  
  s.imgext.field_2._12_4_ = 0;
  s.imgext.field_2._8_4_ = std::setprecision(0x10);
  std::operator<<((ostream *)&std::cout,(_Setprecision)s.imgext.field_2._8_4_);
  this = (Settings *)((long)&t.outdir.field_2 + 8);
  Settings::Settings(this);
  Transformation::Transformation((Transformation *)&d.ntrkptsum);
  Data::Data((Data *)((long)&fjson.field_2 + 8));
  std::__cxx11::string::string((string *)local_3b8);
  s.imgext.field_2._12_4_ =
       loadArgs(argc,argv,this,(Transformation *)&d.ntrkptsum,(string *)local_3b8);
  iVar1 = s.imgext.field_2._12_4_;
  if (s.imgext.field_2._12_4_ == 0) {
    this_00 = &kernel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                  *)this_00,(nullptr_t)0x0);
    s.imgext.field_2._12_4_ = loadJson((string *)local_3b8,(json *)this_00);
    iVar1 = s.imgext.field_2._12_4_;
    if ((s.imgext.field_2._12_4_ == 0) &&
       (s.imgext.field_2._12_4_ =
             loadSettings((Settings *)((long)&t.outdir.field_2 + 8),
                          (json *)&kernel.
                                   super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                                   _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (string *)local_3b8), iVar1 = s.imgext.field_2._12_4_,
       s.imgext.field_2._12_4_ == 0)) {
      getFiles((string *)((long)&s.fname.field_2 + 8),
               (vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                *)((long)&fjson.field_2 + 8));
      this_01 = std::operator<<((ostream *)&std::cout,"Number of GPX files = ");
      sVar2 = std::
              vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
              ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                      *)((long)&fjson.field_2 + 8));
      this_02 = (void *)std::ostream::operator<<(this_01,sVar2);
      std::ostream::operator<<(this_02,std::endl<char,std::char_traits<char>>);
      setTransformation((Transformation *)&d.ntrkptsum);
      s.imgext.field_2._12_4_ =
           loadGpxs((Settings *)((long)&t.outdir.field_2 + 8),(Transformation *)&d.ntrkptsum,
                    (Data *)((long)&fjson.field_2 + 8));
      iVar1 = s.imgext.field_2._12_4_;
      if (s.imgext.field_2._12_4_ == 0) {
        if (((byte)d.ntrkptsum & 1) == 0) {
          setFitting((Settings *)((long)&t.outdir.field_2 + 8),(Data *)((long)&fjson.field_2 + 8));
          getKernel((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &img.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Settings *)((long)&t.outdir.field_2 + 8));
          convolute((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage,
                    (Settings *)((long)&t.outdir.field_2 + 8),(Data *)((long)&fjson.field_2 + 8),
                    (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                    &img.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                     super__Vector_impl_data._M_end_of_storage);
          irwincolor::sortidx<unsigned_int>
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420,
                     (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          if (((byte)s.c.imap & 1) == 0) {
            colorPixels((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f8,
                        (Settings *)((long)&t.outdir.field_2 + 8),
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                        &idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                         .super__Vector_impl_data._M_end_of_storage,
                        (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420);
            std::operator+(&local_518,
                           (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                           &s.step,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                    *)((long)&s.dlm.field_2 + 8));
            s.imgext.field_2._12_4_ =
                 irwincolor::savePng((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                     local_4f8,t.outdir.field_2._8_4_,t.outdir.field_2._12_4_,
                                     &local_518);
            std::__cxx11::string::~string((string *)&local_518);
            std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                      ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_4f8);
          }
          else {
            for (local_424 = 0; uVar3 = (ulong)local_424,
                sVar2 = std::
                        vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        ::size((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                *)((long)&s.cmapFile.field_2 + 8)), uVar3 < sVar2;
                local_424 = local_424 + 1) {
              std::__cxx11::string::string((string *)&local_448,(string *)&s.allCmaps);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&s.cmapFile.field_2 + 8),(long)local_424);
              std::__cxx11::string::string
                        ((string *)
                         &pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage,(string *)pvVar4);
              iVar1 = irwincolor::Map::load
                                ((Map *)&s.verb,&local_448,
                                 (string *)
                                 &pixels.
                                  super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                                  _M_impl.super__Vector_impl_data._M_end_of_storage);
              s.imgext.field_2._12_4_ = ZEXT14(iVar1 != 0);
              std::__cxx11::string::~string
                        ((string *)
                         &pixels.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                          _M_impl.super__Vector_impl_data._M_end_of_storage);
              std::__cxx11::string::~string((string *)&local_448);
              if (iVar1 != 0) {
                argv_local._4_4_ = s.imgext.field_2._12_4_;
                goto LAB_00112d3a;
              }
              colorPixels((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_480,
                          (Settings *)((long)&t.outdir.field_2 + 8),
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                          &idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                           _M_impl.super__Vector_impl_data._M_end_of_storage,
                          (vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420);
              ny = t.outdir.field_2._12_4_;
              nx = t.outdir.field_2._8_4_;
              std::operator+((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pixels_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &s.step,(basic_string<char,_std::char_traits<char>,_std::allocator<char>_>
                                      *)&s.bpp);
              pvVar4 = std::
                       vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                       ::operator[]((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                                     *)((long)&s.cmapFile.field_2 + 8),(long)local_424);
              std::operator+(&local_4c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             &pixels_1.
                              super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>.
                              _M_impl.super__Vector_impl_data._M_end_of_storage,pvVar4);
              std::operator+(&local_4a0,&local_4c0,
                             (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                             ((long)&s.dlm.field_2 + 8));
              iVar1 = irwincolor::savePng((vector<unsigned_char,_std::allocator<unsigned_char>_> *)
                                          local_480,nx,ny,&local_4a0);
              bVar5 = iVar1 != 0;
              s.imgext.field_2._12_4_ = ZEXT14(bVar5);
              std::__cxx11::string::~string((string *)&local_4a0);
              std::__cxx11::string::~string((string *)&local_4c0);
              std::__cxx11::string::~string
                        ((string *)
                         &pixels_1.super__Vector_base<unsigned_char,_std::allocator<unsigned_char>_>
                          ._M_impl.super__Vector_impl_data._M_end_of_storage);
              if (bVar5) {
                argv_local._4_4_ = s.imgext.field_2._12_4_;
              }
              std::vector<unsigned_char,_std::allocator<unsigned_char>_>::~vector
                        ((vector<unsigned_char,_std::allocator<unsigned_char>_> *)local_480);
              if (bVar5) goto LAB_00112d3a;
            }
          }
          argv_local._4_4_ = s.imgext.field_2._12_4_;
LAB_00112d3a:
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)local_420);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &idx.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          std::vector<unsigned_int,_std::allocator<unsigned_int>_>::~vector
                    ((vector<unsigned_int,_std::allocator<unsigned_int>_> *)
                     &img.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage);
          iVar1 = argv_local._4_4_;
        }
        else {
          argv_local._4_4_ = 0;
          iVar1 = argv_local._4_4_;
        }
      }
    }
    argv_local._4_4_ = iVar1;
    nlohmann::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json((basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
                   *)&kernel.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_end_of_storage);
    iVar1 = argv_local._4_4_;
  }
  argv_local._4_4_ = iVar1;
  std::__cxx11::string::~string((string *)local_3b8);
  Data::~Data((Data *)((long)&fjson.field_2 + 8));
  Transformation::~Transformation((Transformation *)&d.ntrkptsum);
  Settings::~Settings((Settings *)((long)&t.outdir.field_2 + 8));
  return argv_local._4_4_;
}

Assistant:

int maph(int argc, char* argv[])
{
	int io = 0;

	std::cout << std::setprecision(16);

	Settings s;
	Transformation t;
	Data d;
	std::string fjson;

	io = loadArgs(argc, argv, s, t, fjson);
	if (io != 0)
		return io;

	json inj;
	io = loadJson(fjson, inj);
	if (io != 0)
		return io;

	io = loadSettings(s, inj, fjson);
	if (io != 0)
		return io;

	getFiles(s.fgpx, d.gpxs);

	//std::cout << "GPX files = " << d.gpxs << std::endl;
	std::cout << "Number of GPX files = " << d.gpxs.size() << std::endl;

	setTransformation(t);

	io = loadGpxs(s, t, d);
	if (io != 0)
		return io;

	if (t.enable)
		return 0;

	setFitting(s, d);
	auto kernel = getKernel(s);
	auto img = convolute(s, d, kernel);
	//return 0;  // for benchmarking kernel convolution

	// Sort for histogram coloring.
	auto idx = irwincolor::sortidx(img);

	if (s.allCmaps)
	{
		for (int i = 0; i < s.mapNames.size(); i++)
		{
			if (io = s.c.load(s.cmapFile, s.mapNames[i]) != 0)
				return io;
			auto pixels = colorPixels(s, img, idx);
			if (io = irwincolor::savePng(pixels, s.nx, s.ny,
					s.fname + s.dlm + s.mapNames[i] + s.imgext)
					!= 0)
				return io;
		}
	}
	else
	{
		auto pixels = colorPixels(s, img, idx);
		io = irwincolor::savePng(pixels, s.nx, s.ny, s.fname + s.imgext);
	}

	return io;
}